

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_q4_1(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  ggml_fp16_t gVar1;
  int j;
  long lVar2;
  float *pfVar3;
  float *x;
  long lVar4;
  int j_1;
  long lVar5;
  int ib;
  float fVar6;
  float extraout_XMM0_Da;
  float fVar7;
  float fVar8;
  float nstep;
  float in_stack_fffffffffffffea8;
  float local_154;
  float *local_150;
  long local_148;
  size_t local_140;
  long local_138;
  int64_t local_130;
  float *local_128;
  long local_120;
  long local_118;
  long local_110;
  void *local_108;
  long local_100;
  uint8_t L [32];
  uint8_t Laux [32];
  float weight [32];
  
  local_130 = nrow;
  local_128 = quant_weights;
  if (quant_weights == (float *)0x0) {
    quantize_row_q4_1_ref(src,(block_q4_1 *)dst,n_per_row * nrow);
    local_140 = ggml_row_size(GGML_TYPE_Q4_1,n_per_row);
  }
  else {
    local_140 = ggml_row_size(GGML_TYPE_Q4_1,n_per_row);
    local_110 = 0;
    local_148 = 0;
    if (0 < n_per_row) {
      local_148 = n_per_row;
    }
    local_100 = n_per_row / 0x20;
    if (n_per_row / 0x20 < 1) {
      local_100 = local_110;
    }
    local_120 = 0;
    if (0 < nrow) {
      local_120 = nrow;
    }
    local_138 = n_per_row << 2;
    lVar4 = (long)dst + 4;
    fVar6 = (float)n_per_row;
    for (; local_110 != local_120; local_110 = local_110 + 1) {
      fVar7 = 0.0;
      for (lVar2 = 0; local_148 != lVar2; lVar2 = lVar2 + 1) {
        fVar6 = src[lVar2] * src[lVar2];
        fVar7 = fVar7 + fVar6;
      }
      pfVar3 = local_128;
      fVar7 = fVar7 / (float)n_per_row;
      local_150 = src;
      local_118 = lVar4;
      local_108 = dst;
      for (lVar2 = 0; lVar2 != local_100; lVar2 = lVar2 + 1) {
        x = local_150 + lVar2 * 0x20;
        nstep = fVar7;
        for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
          fVar8 = pfVar3[lVar5];
          fVar6 = src[lVar5] * src[lVar5] + fVar7;
          if (fVar6 < 0.0) {
            fVar7 = nstep;
            fVar6 = sqrtf(fVar6);
            nstep = fVar7;
            in_stack_fffffffffffffea8 = fVar8;
          }
          else {
            fVar6 = SQRT(fVar6);
          }
          weight[lVar5] = fVar8 * fVar6;
        }
        fVar6 = make_qkx3_quants(0x20,0xf,x,weight,L,&local_154,Laux,fVar6,fVar7,(int)nstep,
                                 SUB41(in_stack_fffffffffffffea8,0));
        gVar1 = ggml_compute_fp32_to_fp16(fVar6);
        dst = local_108;
        *(ggml_fp16_t *)((long)local_108 + lVar2 * 0x14) = gVar1;
        gVar1 = ggml_compute_fp32_to_fp16(-local_154);
        *(ggml_fp16_t *)((long)dst + lVar2 * 0x14 + 2) = gVar1;
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          *(uint8_t *)(lVar4 + lVar5) = L[lVar5 + 0x10] << 4 | L[lVar5];
        }
        src = src + 0x20;
        pfVar3 = pfVar3 + 0x20;
        lVar4 = lVar4 + 0x14;
        fVar6 = extraout_XMM0_Da;
        fVar7 = nstep;
      }
      src = (float *)((long)local_150 + local_138);
      dst = (void *)((long)dst + local_140);
      lVar4 = local_118 + local_140;
    }
  }
  return local_140 * local_130;
}

Assistant:

size_t quantize_q4_1(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    if (!quant_weights) {
        quantize_row_q4_1_ref(src, dst, (int64_t)nrow*n_per_row);
        return nrow * ggml_row_size(GGML_TYPE_Q4_1, n_per_row);
    }
    size_t row_size = ggml_row_size(GGML_TYPE_Q4_1, n_per_row);
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_q4_1_impl(src, (block_q4_1*)qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += row_size;
    }
    return nrow * row_size;
}